

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::add_hl_hl(SM83 *this)

{
  uint uVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  unsigned_short *in_stack_ffffffffffffffc8;
  u32 result;
  SM83 *this_local;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x48;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  ADD HL, HL\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,in_stack_ffffffffffffffc8);
  uVar1 = (uint)(this->field_3).hl + (uint)(this->field_3).hl;
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,(((this->field_3).hl & 0xfff) + ((this->field_3).hl & 0xfff) & 0x1000) != 0)
  ;
  SetCarryFlag(this,(uVar1 & 0x10000) != 0);
  (this->field_3).hl = (u16)uVar1;
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::add_hl_hl() {
    LTRACE("ADD HL, HL");
    u32 result = hl + hl;

    SetNegateFlag(false);
    SetHalfCarryFlag(((hl & 0xFFF) + (hl & 0xFFF)) & 0x1000);
    SetCarryFlag((result & 0x10000) != 0);

    hl = static_cast<u16>(result);

    timer.AdvanceCycles(4);
}